

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::Array<const_kj::ArrayPtr<const_unsigned_char>_>::~Array
          (Array<const_kj::ArrayPtr<const_unsigned_char>_> *this)

{
  dispose(this);
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }